

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O2

int argument(object *proc,int parBlkSize,object *currentParam)

{
  int index;
  int *piVar1;
  object *poVar2;
  typeDesc *ptVar3;
  typeDesc *ptVar4;
  char *msg;
  int iVar5;
  
  if (currentSymbol == 0x25f) {
    piVar1 = &intTypeIndex;
LAB_00105910:
    index = *piVar1;
    getSymbol();
    if (currentSymbol != 0x1f5) {
LAB_00105a31:
      msg = "missing identifier";
LAB_00105a5c:
      mark(msg);
      exit(-1);
    }
    if (proc->hasPrototype == 1) {
      stringCopy(idName,currentParam->name);
      poVar2 = (object *)0x0;
    }
    else {
      poVar2 = newObj(0x2c1);
      poVar2->typeIndex = index;
    }
    ptVar3 = getType(index);
    iVar5 = ptVar3->size;
    getSymbol();
    if (currentSymbol != 0x130) {
      if ((proc->hasPrototype == 1) && (currentParam->typeIndex != index)) {
        msg = "type mismatch in prototype or declaration";
        goto LAB_00105a5c;
      }
      goto LAB_00105a1c;
    }
    getSymbol();
    if (currentSymbol != 0x12f) {
      msg = "missing right bracket";
      goto LAB_00105a5c;
    }
    if (proc->hasPrototype == 1) {
      ptVar3 = getType(currentParam->typeIndex);
      if ((ptVar3->form != 0x322) || (ptVar3->base->index != index)) {
        msg = "type mismatch in prototype and declaration";
        goto LAB_00105a5c;
      }
    }
    else {
      ptVar3 = newType();
      ptVar3->form = 0x322;
      ptVar4 = getType(index);
      ptVar3->base = ptVar4;
      ptVar3->size = 0xc;
      poVar2->typeIndex = ptVar3->index;
      poVar2->cl = 0x2c5;
    }
    iVar5 = 0xc;
  }
  else {
    if (currentSymbol == 0x26d) {
      piVar1 = &boolTypeIndex;
      goto LAB_00105910;
    }
    if (currentSymbol != 0x268) {
      if (currentSymbol != 0x261) {
        msg = "bad argument";
        goto LAB_00105a5c;
      }
      piVar1 = &charTypeIndex;
      goto LAB_00105910;
    }
    getSymbol();
    if (currentSymbol != 0x1f5) goto LAB_00105a31;
    getSymbol();
    poVar2 = find();
    ptVar3 = getType(poVar2->typeIndex);
    if (currentSymbol != 99) {
      msg = "bad struct variable";
      goto LAB_00105a5c;
    }
    getSymbol();
    if (currentSymbol != 0x1f5) {
      msg = "missing variable name";
      goto LAB_00105a5c;
    }
    if (proc->hasPrototype == 1) {
      stringCopy(idName,currentParam->name);
      if (currentParam->typeIndex != ptVar3->refIndex) {
        msg = "type mismatch in prototype/declaration";
        goto LAB_00105a5c;
      }
    }
    else {
      poVar2 = newObj(0x2c5);
      poVar2->typeIndex = ptVar3->refIndex;
    }
    iVar5 = 4;
  }
  getSymbol();
LAB_00105a1c:
  return iVar5 + parBlkSize;
}

Assistant:

procedure 
int argument(struct object *proc, int parBlkSize, struct object *currentParam)  {
	variable struct object *obj;
	variable struct typeDesc *type; variable struct typeDesc *tp;
	variable int tpIndex; variable int parSize;
	obj = NULL; tp = NULL; type = NULL; parSize = 0;tpIndex=0;
	
	if ((currentSymbol == SYMBOL_INT) || (currentSymbol == SYMBOL_CHAR) || (currentSymbol == SYMBOL_BOOL)) {
		if (currentSymbol == SYMBOL_INT){
			tpIndex = intTypeIndex;
		} elsif (currentSymbol == SYMBOL_CHAR){
			tpIndex = charTypeIndex;
		} elsif (currentSymbol == SYMBOL_BOOL) {
			tpIndex = boolTypeIndex;
		}
		getSymbol();
		if (currentSymbol == SYMBOL_IDENTIFIER) { /* int x */
			if (proc->hasPrototype == true) {
				stringCopy(idName,currentParam->name); 
			} else { 
				obj = newObj(CLASS_VAR); 
				obj->typeIndex = tpIndex;
			}
			type = getType(tpIndex);
			parSize = parBlkSize + type->size;
			getSymbol();
			if (currentSymbol == SYMBOL_LBRAK) {
				getSymbol();
				if (currentSymbol == SYMBOL_RBRAK) { /* we have an array, such as char a[] */
					if (proc->hasPrototype == true) { /* check consistency */
						type = getType(currentParam->typeIndex);
						if ((type->form != FORM_ARRAY) || (type->base->index != tpIndex))  { /* check form, base (differ) */
							mark("type mismatch in prototype and declaration");
							exit(-1);
						}
					} else {
						tp = newType();
						tp->form = FORM_ARRAY;
						type = getType(tpIndex);
						tp->base = type;
						tp->size = wordSize + 8; /* adr + len + onstack */ 
						obj->typeIndex = tp->index;
						obj->cl = CLASS_PAR; 
					}
					parSize = parBlkSize + wordSize + 8;
					getSymbol();
				} else {
					mark("missing right bracket");
					exit(-1);
				}
			} else { /* consistency type check for non-array vars */
				if (proc->hasPrototype == true) {
					if (currentParam->typeIndex != tpIndex) {
						mark("type mismatch in prototype or declaration");
						exit(-1);
					}
				}
			}
			
		} else {
			mark("missing identifier");
			exit(-1);
		}
	} elsif (currentSymbol == SYMBOL_STRUCT) { 
		getSymbol();
		if (currentSymbol == SYMBOL_IDENTIFIER) {
			getSymbol();
			obj = find();
			type = getType(obj->typeIndex);
			if (currentSymbol == SYMBOL_MUL) {
				getSymbol();
				if (currentSymbol == SYMBOL_IDENTIFIER) {
					if (proc->hasPrototype == true) {
						stringCopy(idName,currentParam->name);
						if (currentParam->typeIndex != type->refIndex) {
							mark("type mismatch in prototype/declaration");
							exit(-1);
						}
					} else {
						obj = newObj(CLASS_PAR);
						obj->typeIndex = type->refIndex;
					}
					parSize = parBlkSize + wordSize;
					getSymbol();
				} else {
					mark("missing variable name");
					exit(-1);
				}
			} else {
				mark("bad struct variable");
				exit(-1);
			}
		} else {
			mark("missing identifier");
			exit(-1);
		}
	} else {
		mark("bad argument");
		exit(-1);
	}
	return parSize;
}